

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

TranslationBlock_conflict *
tb_gen_code_sparc(CPUState *cpu,target_ulong_conflict pc,target_ulong_conflict cs_base,
                 uint32_t flags,int cflags)

{
  undefined4 uVar1;
  TCGContext_conflict6 *s;
  TCGContext_conflict6 *pTVar2;
  byte *pbVar3;
  uc_struct *uc;
  uintptr_t uVar4;
  long *plVar5;
  bool bVar6;
  PageDesc *pPVar7;
  bool bVar8;
  uint uVar9;
  TranslationBlock *tb;
  ulong extraout_RAX;
  void *pvVar10;
  byte *pbVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  tb_page_addr_t tVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  tb_page_addr_t phys2;
  TranslationBlock *pTVar19;
  PageDesc *p2;
  PageDesc *p;
  PageDesc *local_88;
  uint local_80;
  undefined4 uStack_7c;
  tb_page_addr_t local_78;
  void *local_70;
  uint32_t local_64;
  target_ulong_conflict local_60;
  uint32_t local_5c;
  ulong local_58;
  CPUArchState_conflict16 *local_50;
  byte *local_48;
  CPUState *local_40;
  TranslationBlock *local_38;
  
  s = cpu->uc->tcg_ctx;
  local_50 = (CPUArchState_conflict16 *)cpu->env_ptr;
  local_60 = cs_base;
  local_5c = flags;
  local_78 = get_page_addr_code_sparc(local_50,pc);
  uVar16 = cflags | 0x10000;
  if (local_78 != 0xffffffffffffffff) {
    uVar16 = cflags;
  }
  uVar9 = cpu->cluster_index;
  iVar13 = cpu->singlestep_enabled;
  tb = tcg_tb_alloc_sparc((TCGContext_conflict7 *)s);
  pTVar19 = (TranslationBlock *)(ulong)uVar9;
  if (tb == (TranslationBlock *)0x0) {
LAB_009f06b5:
    tb_gen_code_sparc_cold_2();
    tb = pTVar19;
LAB_009f06bf:
    tb_page_remove((PageDesc *)CONCAT44(uStack_7c,local_80),(TranslationBlock_conflict *)tb);
    lVar12 = CONCAT44(uStack_7c,local_80);
    g_free(*(gpointer *)(lVar12 + 8));
    *(undefined8 *)(lVar12 + 8) = 0;
    *(undefined4 *)(lVar12 + 0x10) = 0;
    if (local_88 != (PageDesc *)0x0) {
      tb_page_remove(local_88,(TranslationBlock_conflict *)tb);
      pPVar7 = local_88;
      g_free(local_88->code_bitmap);
      pPVar7->code_bitmap = (unsigned_long *)0x0;
      pPVar7->code_write_count = 0;
    }
    if (local_38 == tb) {
LAB_009f0697:
      tcg_tb_insert_sparc((TCGContext_conflict7 *)s,tb);
    }
    else {
      lVar12 = (long)((uc_struct_conflict8 *)s->gen_insn_data[0xb2][1])->qemu_icache_linesize;
      s->code_gen_ptr = (void *)((long)local_70 - (-lVar12 & lVar12 + 0x97U));
      tb = local_38;
    }
    return (TranslationBlock_conflict *)tb;
  }
  local_64 = uVar9 << 0x18 | uVar16 & 0xffffff;
  uVar16 = uVar16 & 0x7fff;
  uVar9 = 0x200;
  if (uVar16 < 0x200) {
    uVar9 = uVar16;
  }
  if (uVar16 == 0) {
    uVar9 = 0x200;
  }
  uVar16 = 1;
  if (iVar13 == 0) {
    uVar16 = uVar9;
  }
  local_40 = (CPUState *)(local_50[-0xd].regbase + 0x26);
  local_58 = (ulong)pc;
LAB_009f01d1:
  local_70 = s->code_gen_ptr;
  *(void **)&tb->cflags = local_70;
  *(int *)&tb->pc = (int)local_58;
  *(target_ulong_conflict *)((long)&tb->pc + 4) = local_60;
  *(uint32_t *)&tb->cs_base = local_5c;
  tb->flags = local_64;
  (tb->tc).size = 0;
  uVar1 = (undefined4)cpu->trace_dstate[0];
  tb->size = (short)uVar1;
  tb->icount = (short)((uint)uVar1 >> 0x10);
  s->tb_cflags = local_64;
  uVar9 = uVar16;
  do {
    uVar16 = uVar9;
    tcg_func_start_sparc((TCGContext_conflict7 *)s);
    s->cpu = local_40;
    gen_intermediate_code_sparc(cpu,(TranslationBlock_conflict *)tb,uVar16);
    s->cpu = (CPUState *)0x0;
    *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
    s->tb_jmp_reset_offset = (uint16_t *)(tb->page_addr + 1);
    s->tb_jmp_insn_offset = (uintptr_t *)tb->jmp_reset_offset;
    s->tb_jmp_target_addr = (uintptr_t *)0x0;
    uVar9 = tcg_gen_code_sparc((TCGContext_conflict7 *)s,tb);
    if (-1 < (int)uVar9) {
      pvVar10 = (void *)(ulong)uVar9;
      local_48 = (byte *)((long)local_70 + (long)pvVar10);
      uVar14 = (ulong)*(ushort *)((long)&tb->cs_base + 6);
      pbVar11 = local_48;
      if (uVar14 == 0) goto LAB_009f03ea;
      pTVar2 = cpu->uc->tcg_ctx;
      pbVar3 = (byte *)pTVar2->code_gen_highwater;
      uVar18 = 0;
      goto LAB_009f02fb;
    }
    tb_gen_code_sparc_cold_1();
    uVar9 = local_80;
  } while ((extraout_RAX & 1) == 0);
  goto LAB_009f0293;
  while (uVar18 = uVar18 + 1, uVar18 != uVar14) {
LAB_009f02fb:
    lVar12 = 0;
    bVar8 = true;
    do {
      bVar6 = bVar8;
      if (uVar18 == 0) {
        iVar13 = 0;
        if (bVar6) {
          iVar13 = (int)tb->pc;
        }
      }
      else {
        iVar13 = *(int *)((long)(pTVar2->gen_insn_data + -1) + (uVar18 * 4 + lVar12 * 2 + 8) * 2);
      }
      uVar9 = *(int *)((long)pTVar2->gen_insn_data[0] + lVar12 * 4 + uVar18 * 8) - iVar13;
      while ((0x3f < uVar9 && (((int)uVar9 >> 7 == 0xffffffffU & (byte)((uVar9 & 0x40) >> 6)) == 0))
            ) {
        *pbVar11 = (byte)uVar9 | 0x80;
        pbVar11 = pbVar11 + 1;
        uVar9 = (int)uVar9 >> 7;
      }
      *pbVar11 = (byte)uVar9 & 0x7f;
      pbVar11 = pbVar11 + 1;
      lVar12 = 1;
      uVar9 = 0;
      bVar8 = false;
    } while (bVar6);
    if (uVar18 != 0) {
      uVar9 = (uint)pTVar2->gen_insn_end_off[uVar18 - 1];
    }
    uVar9 = pTVar2->gen_insn_end_off[uVar18] - uVar9;
    while ((0x3f < uVar9 && (((int)uVar9 >> 7 == 0xffffffffU & (byte)((uVar9 & 0x40) >> 6)) == 0)))
    {
      *pbVar11 = (byte)uVar9 | 0x80;
      pbVar11 = pbVar11 + 1;
      uVar9 = (int)uVar9 >> 7;
    }
    *pbVar11 = (byte)uVar9 & 0x7f;
    pbVar11 = pbVar11 + 1;
    if (pbVar3 < pbVar11) goto LAB_009f0293;
  }
LAB_009f03ea:
  uVar9 = (int)pbVar11 - (int)local_48;
  if (-1 < (int)uVar9) {
    (tb->tc).ptr = pvVar10;
    s->code_gen_ptr =
         (void *)((long)local_70 + (long)pvVar10 + (ulong)(uVar9 & 0x7fffffff) + 0xf &
                 0xfffffffffffffff0);
    tb->jmp_list_next[0] = 0;
    tb->jmp_list_next[1] = 0;
    *(undefined1 (*) [16])(tb->jmp_target_arg + 1) = (undefined1  [16])0x0;
    tb->jmp_dest[0] = 0;
    uVar14 = (ulong)(ushort)tb->page_addr[1];
    if (uVar14 != 0xffff) {
      tb_set_jmp_target_sparc(tb,0,uVar14 + *(long *)&tb->cflags);
    }
    uVar14 = local_58;
    tVar15 = local_78;
    uVar18 = (ulong)*(ushort *)((long)tb->page_addr + 10);
    if (uVar18 != 0xffff) {
      tb_set_jmp_target_sparc(tb,1,uVar18 + *(long *)&tb->cflags);
    }
    uVar16 = ((uint)uVar14 + (uint)*(ushort *)((long)&tb->cs_base + 4)) - 1 & 0xfffff000;
    phys2 = 0xffffffffffffffff;
    if (((uint)uVar14 & 0xfffff000) != uVar16) {
      phys2 = get_page_addr_code_sparc(local_50,uVar16);
    }
    uc = (uc_struct *)cpu->uc;
    local_88 = (PageDesc *)0x0;
    if (tVar15 == 0xffffffffffffffff) {
      if ((tb->flags & 0x10000) == 0) {
        __assert_fail("tb->cflags & CF_NOCACHE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x66c,
                      "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                     );
      }
      *(undefined4 *)(tb->page_next + 1) = 0xffffffff;
      *(undefined4 *)((long)tb->page_next + 0xc) = 0xffffffff;
      *(undefined4 *)tb->page_addr = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
      goto LAB_009f0697;
    }
    page_lock_pair((uc_struct_conflict8 *)uc,(PageDesc **)&local_80,tVar15,&local_88,phys2,1);
    plVar5 = (long *)CONCAT44(uStack_7c,local_80);
    uVar14 = (ulong)((uint)tVar15 & 0xfffff000);
    tb->page_next[1] = uVar14;
    pTVar19 = (TranslationBlock *)*plVar5;
    tb->orig_tb = pTVar19;
    *plVar5 = (long)tb;
    g_free((gpointer)plVar5[1]);
    plVar5[1] = 0;
    *(undefined4 *)(plVar5 + 2) = 0;
    if (pTVar19 == (TranslationBlock *)0x0) {
      tlb_protect_code_sparc((uc_struct_conflict8 *)uc,uVar14);
    }
    pPVar7 = local_88;
    if (local_88 == (PageDesc *)0x0) {
      tb->page_addr[0] = 0xffffffffffffffff;
      tVar15 = local_78;
    }
    else {
      tb->page_addr[0] = phys2;
      uVar4 = local_88->first_tb;
      tb->page_next[0] = uVar4;
      local_88->first_tb = (ulong)tb | 1;
      g_free(local_88->code_bitmap);
      tVar15 = local_78;
      pPVar7->code_bitmap = (unsigned_long *)0x0;
      pPVar7->code_write_count = 0;
      if (uVar4 == 0) {
        tlb_protect_code_sparc((uc_struct_conflict8 *)uc,phys2);
      }
    }
    if ((tb->flags >> 0x10 & 1) != 0) goto LAB_009f0697;
    local_38 = (TranslationBlock *)0x0;
    uVar16 = (int)tVar15 * -0x7a143589 + 0x24234429;
    uVar9 = uVar16 * 0x2000 | uVar16 >> 0x13;
    uVar16 = (int)(tVar15 >> 0x20) * -0x7a143589 + 0x85ebca78;
    uVar16 = uVar16 * 0x2000 | uVar16 >> 0x13;
    uVar17 = (int)tb->pc * -0x7a143589 + 1;
    uVar17 = uVar17 * 0x2000 | uVar17 >> 0x13;
    uVar16 = (uVar17 * 0x779b1000 | uVar17 * -0x61c8864f >> 0x14) +
             (int)tb->cs_base * -0x3d4d51c3 +
             (uVar9 * 0x3c6ef362 | (uint)((int)(uVar9 * -0x61c8864f) < 0)) +
             (uVar16 * 0x1bbcd880 | uVar16 * -0x61c8864f >> 0x19) + 0x91a7a6fd;
    uVar16 = (tb->flags & 0xff0affff) * -0x3d4d51c3 +
             (uVar16 * 0x20000 | uVar16 >> 0xf) * 0x27d4eb2f;
    uVar16 = *(int *)&tb->size * -0x3d4d51c3 + (uVar16 * 0x20000 | uVar16 >> 0xf) * 0x27d4eb2f;
    uVar16 = (uVar16 * 0x20000 | uVar16 >> 0xf) * 0x27d4eb2f;
    uVar16 = (uVar16 >> 0xf ^ uVar16) * -0x7a143589;
    uVar16 = (uVar16 >> 0xd ^ uVar16) * -0x3d4d51c3;
    uVar16 = uVar16 >> 0x10 ^ uVar16;
    *(uint *)(tb->jmp_dest + 1) = uVar16;
    qht_insert(uc,(qht *)(uc->tcg_ctx->gen_insn_data + 0x100),tb,uVar16,&local_38);
    if (local_38 == (TranslationBlock *)0x0) goto LAB_009f0697;
    goto LAB_009f06bf;
  }
LAB_009f0293:
  tb = tcg_tb_alloc_sparc((TCGContext_conflict7 *)s);
  pTVar19 = tb;
  if (tb == (TranslationBlock *)0x0) goto LAB_009f06b5;
  goto LAB_009f01d1;
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}